

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZStructMatrix.cpp
# Opt level: O1

int __thiscall TPZStructMatrix::ClassId(TPZStructMatrix *this)

{
  uint uVar1;
  int iVar2;
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"TPZStructMatrix","");
  uVar1 = Hash(&local_40);
  iVar2 = TPZStrMatParInterface::ClassId
                    ((TPZStrMatParInterface *)(&this->field_0x0 + *(long *)(*(long *)this + -0x60)))
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return iVar2 * 2 ^ uVar1;
}

Assistant:

int TPZStructMatrix::ClassId() const{
    return Hash("TPZStructMatrix") ^
        TPZStrMatParInterface::ClassId() << 1;
}